

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputParser.cpp
# Opt level: O2

string * __thiscall
InputParser::getCmdOption(string *__return_storage_ptr__,InputParser *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  pointer this_00;
  allocator local_11;
  
  this_00 = (this->tokens).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->tokens).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pbVar1 = (this->tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var2._M_current == pbVar1) || (_Var2._M_current + 1 == pbVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    removeQuotes(__return_storage_ptr__,(InputParser *)this_00,_Var2._M_current + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const string InputParser::getCmdOption(const string &option) {
    vector<string>::const_iterator itr;

    itr =  find(this->tokens.begin(), this->tokens.end(), option);

    if (itr != this->tokens.end() && ++itr != this->tokens.end())
        return removeQuotes(*itr);

    return "";
}